

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_duckdb_result_type_&,_const_duckdb_result_type_&> * __thiscall
Catch::ExprLhs<duckdb_result_type_const&>::operator==
          (ExprLhs<const_duckdb_result_type_&> *this,duckdb_result_type *rhs)

{
  StringRef op;
  bool comparisonResult;
  duckdb_result_type *in_RDX;
  duckdb_result_type *in_RSI;
  BinaryExpr<const_duckdb_result_type_&,_const_duckdb_result_type_&> *in_RDI;
  duckdb_result_type *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb8;
  char *pcVar1;
  BinaryExpr<const_duckdb_result_type_&,_const_duckdb_result_type_&> *pBVar2;
  
  pBVar2 = in_RDI;
  comparisonResult =
       compareEqual<duckdb_result_type,duckdb_result_type>(*(duckdb_result_type **)in_RSI,in_RDX);
  pcVar1 = *(char **)in_RSI;
  StringRef::StringRef
            ((StringRef *)in_RDI,(char *)CONCAT17(comparisonResult,in_stack_ffffffffffffffb8));
  op.m_size = (size_type)pBVar2;
  op.m_start = pcVar1;
  BinaryExpr<const_duckdb_result_type_&,_const_duckdb_result_type_&>::BinaryExpr
            (in_RDI,comparisonResult,in_RSI,op,in_stack_ffffffffffffffa8);
  return pBVar2;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }